

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool intersection(Segment *segment,BoundingBox *box)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar1 = (segment->b).x;
  uVar2 = (segment->b).y;
  fVar11 = (float)uVar2 - (segment->a).y;
  fVar7 = (segment->b).z - (segment->a).z;
  fVar10 = (float)uVar1 - (segment->a).x;
  fVar4 = fVar7 * fVar7 + fVar10 * fVar10 + fVar11 * fVar11;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar10 = 1.0 / (fVar10 / fVar4);
  fVar11 = 1.0 / (fVar11 / fVar4);
  fVar8 = 1.0 / (fVar7 / fVar4);
  fVar4 = (segment->a).x;
  fVar7 = (segment->a).y;
  fVar6 = ((box->vMin).x - fVar4) * fVar10;
  fVar10 = ((box->vMax).x - fVar4) * fVar10;
  fVar5 = ((box->vMin).y - fVar7) * fVar11;
  fVar11 = ((box->vMax).y - fVar7) * fVar11;
  fVar4 = (segment->a).z;
  fVar7 = ((box->vMin).z - fVar4) * fVar8;
  fVar8 = ((box->vMax).z - fVar4) * fVar8;
  fVar4 = fVar11;
  if (fVar11 <= fVar5) {
    fVar4 = fVar5;
  }
  fVar9 = fVar10;
  if (fVar10 <= fVar6) {
    fVar9 = fVar6;
  }
  if (fVar9 <= fVar4) {
    fVar4 = fVar9;
  }
  fVar9 = fVar8;
  if (fVar8 <= fVar7) {
    fVar9 = fVar7;
  }
  if (fVar4 <= fVar9) {
    fVar9 = fVar4;
  }
  if (0.0 <= fVar9) {
    if (fVar6 <= fVar10) {
      fVar10 = fVar6;
    }
    if (fVar5 <= fVar11) {
      fVar11 = fVar5;
    }
    if (fVar11 <= fVar10) {
      fVar11 = fVar10;
    }
    if (fVar7 <= fVar8) {
      fVar8 = fVar7;
    }
    if (fVar8 <= fVar11) {
      fVar8 = fVar11;
    }
    bVar3 = fVar8 <= fVar9;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool intersection(Segment const& segment, BoundingBox const& box)
{
  Vector dir = normalize(segment.b - segment.a);
  float dirfracX;
  float dirfracY;
  float dirfracZ;
  dirfracX = 1.0f / dir.x;
  dirfracY = 1.0f / dir.y;
  dirfracZ = 1.0f / dir.z;

  float t1 = (box.vMin.x - segment.a.x) * dirfracX;
  float t2 = (box.vMax.x - segment.a.x) * dirfracX;
  float t3 = (box.vMin.y - segment.a.y) * dirfracY;
  float t4 = (box.vMax.y - segment.a.y) * dirfracY;
  float t5 = (box.vMin.z - segment.a.z) * dirfracZ;
  float t6 = (box.vMax.z - segment.a.z) * dirfracZ;

  float tmin = std::max(std::max(std::min(t1, t2), std::min(t3, t4)), std::min(t5, t6));
  float tmax = std::min(std::min(std::max(t1, t2), std::max(t3, t4)), std::max(t5, t6));

  if (tmax < 0)
  {
    return false;
  }

  if (tmin > tmax)
  {
    return false;
  }
  return true;
}